

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriter.cpp
# Opt level: O3

uint64_t __thiscall MILBlob::Blob::FileWriter::GetNextAlignedOffset(FileWriter *this)

{
  long lVar1;
  
  std::istream::seekg((long)this,_S_beg);
  lVar1 = std::istream::tellg();
  return lVar1 + 0x3fU & 0xffffffffffffffc0;
}

Assistant:

uint64_t FileWriter::GetNextAlignedOffset()
{
    m_fileStream.seekg(0, std::ios::end);
    uint64_t offset = static_cast<uint64_t>(m_fileStream.tellg());
    if (offset % DefaultStorageAlignment == 0) {
        return offset;
    }
    auto pad = DefaultStorageAlignment - (offset % DefaultStorageAlignment);
    return offset + pad;
}